

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistry.cpp
# Opt level: O3

void __thiscall TestRegistry::runAllTests(TestRegistry *this,TestResult *result)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TestResult *pTVar3;
  UtestShell *this_00;
  
  (*result->_vptr_TestResult[2])(result);
  this_00 = this->tests_;
  if (this_00 != (UtestShell *)0x0) {
    bVar1 = true;
    do {
      if (this->runInSeperateProcess_ == true) {
        (*this_00->_vptr_UtestShell[0x20])(this_00);
      }
      if (this->runIgnored_ == true) {
        (*this_00->_vptr_UtestShell[0x21])(this_00);
      }
      if (bVar1 != false) {
        (*result->_vptr_TestResult[4])(result,this_00);
      }
      (*result->_vptr_TestResult[8])(result);
      bVar1 = UtestShell::shouldRun(this_00,this->groupFilters_,this->nameFilters_);
      pTVar3 = result;
      if (bVar1) {
        (*result->_vptr_TestResult[6])(result,this_00);
        (*this_00->_vptr_UtestShell[0x24])(this_00,this->firstPlugin_,result);
        (*result->_vptr_TestResult[7])(result,this_00);
      }
      else {
        (*result->_vptr_TestResult[0xb])();
      }
      bVar1 = endOfGroup((TestRegistry *)pTVar3,this_00);
      if (bVar1) {
        (*result->_vptr_TestResult[5])(result,this_00);
      }
      iVar2 = (*this_00->_vptr_UtestShell[3])(this_00);
      this_00 = (UtestShell *)CONCAT44(extraout_var,iVar2);
    } while (this_00 != (UtestShell *)0x0);
  }
  (*result->_vptr_TestResult[3])(result);
  this->currentRepetition_ = this->currentRepetition_ + 1;
  return;
}

Assistant:

void TestRegistry::runAllTests(TestResult& result)
{
    bool groupStart = true;

    result.testsStarted();
    for (UtestShell *test = tests_; test != NULLPTR; test = test->getNext()) {
        if (runInSeperateProcess_) test->setRunInSeperateProcess();
        if (runIgnored_) test->setRunIgnored();

        if (groupStart) {
            result.currentGroupStarted(test);
            groupStart = false;
        }

        result.countTest();
        if (testShouldRun(test, result)) {
            result.currentTestStarted(test);
            test->runOneTest(firstPlugin_, result);
            result.currentTestEnded(test);
        }

        if (endOfGroup(test)) {
            groupStart = true;
            result.currentGroupEnded(test);
        }
    }
    result.testsEnded();
    currentRepetition_++;
}